

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  curl_llist_element *pcVar1;
  connectdata *pcVar2;
  CURLMcode CVar3;
  CURLMcode CVar4;
  time_t tVar5;
  Curl_sh_entry *pCVar6;
  Curl_tree *pCVar7;
  int iVar8;
  undefined7 in_register_00000031;
  Curl_easy *pCVar9;
  curltime cVar10;
  curltime now;
  curltime i;
  curltime now_00;
  Curl_tree *t;
  int *local_d8;
  sigpipe_ignore pipe_st;
  
  cVar10 = Curl_now();
  tVar5 = cVar10.tv_sec;
  if ((int)CONCAT71(in_register_00000031,checkall) != 0) {
    CVar3 = curl_multi_perform(multi,running_handles);
    if (CVar3 == CURLM_BAD_HANDLE) {
      return CURLM_BAD_HANDLE;
    }
    pCVar9 = (Curl_easy *)&multi->easyp;
    while( true ) {
      if (CVar3 != CURLM_OK) {
        return CVar3;
      }
      pCVar9 = pCVar9->next;
      if (pCVar9 == (Curl_easy *)0x0) break;
      CVar3 = singlesocket(multi,pCVar9);
    }
    return CURLM_OK;
  }
  iVar8 = cVar10.tv_usec;
  local_d8 = running_handles;
  if (s == -1) {
    (multi->timer_lastcall).tv_sec = 0;
    *(undefined8 *)&(multi->timer_lastcall).tv_usec = 0;
  }
  else {
    pCVar6 = sh_getentry(&multi->sockhash,s);
    if (pCVar6 != (Curl_sh_entry *)0x0) {
      CVar3 = CURLM_OK;
      while (pcVar1 = (pCVar6->list).head, pcVar1 != (curl_llist_element *)0x0) {
        pCVar9 = (Curl_easy *)pcVar1->ptr;
        if (pCVar9->magic != 0xc0dedbad) {
          return CURLM_INTERNAL_ERROR;
        }
        pcVar2 = pCVar9->conn;
        if ((pcVar2 != (connectdata *)0x0) && ((pcVar2->handler->flags & 8) == 0)) {
          pcVar2->cselect_bits = ev_bitmask;
        }
        sigpipe_ignore(pCVar9,&pipe_st);
        now._12_4_ = 0;
        now.tv_sec = SUB128(cVar10._0_12_,0);
        now.tv_usec = SUB124(cVar10._0_12_,8);
        CVar3 = multi_runsingle(multi,now,pCVar9);
        sigpipe_restore(&pipe_st);
        pcVar2 = pCVar9->conn;
        if ((pcVar2 != (connectdata *)0x0) && ((pcVar2->handler->flags & 8) == 0)) {
          pcVar2->cselect_bits = 0;
        }
        if (CVar3 < CURLM_BAD_HANDLE) {
          CVar4 = singlesocket(multi,pCVar9);
          CVar3 = CURLM_OK;
          if (CVar4 != CURLM_OK) {
            return CVar4;
          }
        }
        pCVar6 = (Curl_sh_entry *)&pcVar1->next;
      }
      cVar10 = Curl_now();
      tVar5 = cVar10.tv_sec;
      iVar8 = cVar10.tv_usec;
      goto LAB_0010cf63;
    }
  }
  CVar3 = CURLM_OK;
LAB_0010cf63:
  pCVar9 = (Curl_easy *)0x0;
  do {
    if (pCVar9 != (Curl_easy *)0x0) {
      sigpipe_ignore(pCVar9,&pipe_st);
      cVar10.tv_usec = iVar8;
      cVar10.tv_sec = tVar5;
      cVar10._12_4_ = 0;
      CVar3 = multi_runsingle(multi,cVar10,pCVar9);
      sigpipe_restore(&pipe_st);
      if (CVar3 < CURLM_BAD_HANDLE) {
        CVar4 = singlesocket(multi,pCVar9);
        CVar3 = CURLM_OK;
        if (CVar4 != CURLM_OK) {
          return CVar4;
        }
      }
    }
    i.tv_usec = iVar8;
    i.tv_sec = tVar5;
    i._12_4_ = 0;
    pCVar7 = Curl_splaygetbest(i,multi->timetree,&t);
    multi->timetree = pCVar7;
    if (t == (Curl_tree *)0x0) break;
    pCVar9 = (Curl_easy *)t->payload;
    now_00.tv_usec = iVar8;
    now_00.tv_sec = tVar5;
    now_00._12_4_ = 0;
    add_next_timeout(now_00,multi,pCVar9);
  } while (t != (Curl_tree *)0x0);
  *local_d8 = multi->num_alive;
  return CVar3;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct Curl_tree *t;
  struct curltime now = Curl_now();

  if(checkall) {
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      data = multi->easyp;
      while(data && !result) {
        result = singlesocket(multi, data);
        data = data->next;
      }
    }

    /* or should we fall-through and do the timer-based stuff? */
    return result;
  }
  if(s != CURL_SOCKET_TIMEOUT) {

    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry)
      /* Unmatched socket, we can't act on it but we ignore this fact.  In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      ;
    else {
      struct curl_llist *list = &entry->list;
      struct curl_llist_element *e;
      SIGPIPE_VARIABLE(pipe_st);

      /* the socket can be shared by many transfers, iterate */
      for(e = list->head; e; e = e->next) {
        data = (struct Curl_easy *)e->ptr;

        if(data->magic != CURLEASY_MAGIC_NUMBER)
          /* bad bad bad bad bad bad bad */
          return CURLM_INTERNAL_ERROR;

        if(data->conn && !(data->conn->handler->flags & PROTOPT_DIRLOCK))
          /* set socket event bitmask if they're not locked */
          data->conn->cselect_bits = ev_bitmask;

        sigpipe_ignore(data, &pipe_st);
        result = multi_runsingle(multi, now, data);
        sigpipe_restore(&pipe_st);

        if(data->conn && !(data->conn->handler->flags & PROTOPT_DIRLOCK))
          /* clear the bitmask only if not locked */
          data->conn->cselect_bits = 0;

        if(CURLM_OK >= result) {
          /* get the socket(s) and check if the state has been changed since
             last */
          result = singlesocket(multi, data);
          if(result)
            return result;
        }
      }

      /* Now we fall-through and do the timer-based stuff, since we don't want
         to force the user to have to deal with timeouts as long as at least
         one connection in fact has traffic. */

      data = NULL; /* set data to NULL again to avoid calling
                      multi_runsingle() in case there's no need to */
      now = Curl_now(); /* get a newer time since the multi_runsingle() loop
                           may have taken some time */
    }
  }
  else {
    /* Asked to run due to time-out. Clear the 'lastcall' variable to force
       update_timer() to trigger a callback to the app again even if the same
       timeout is still the one to run after this call. That handles the case
       when the application asks libcurl to run the timeout prematurely. */
    memset(&multi->timer_lastcall, 0, sizeof(multi->timer_lastcall));
  }

  /*
   * The loop following here will go on as long as there are expire-times left
   * to process in the splay and 'data' will be re-assigned for every expired
   * handle we deal with.
   */
  do {
    /* the first loop lap 'data' can be NULL */
    if(data) {
      SIGPIPE_VARIABLE(pipe_st);

      sigpipe_ignore(data, &pipe_st);
      result = multi_runsingle(multi, now, data);
      sigpipe_restore(&pipe_st);

      if(CURLM_OK >= result) {
        /* get the socket(s) and check if the state has been changed since
           last */
        result = singlesocket(multi, data);
        if(result)
          return result;
      }
    }

    /* Check if there's one (more) expired timer to deal with! This function
       extracts a matching node if there is one */

    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t) {
      data = t->payload; /* assign this for next loop */
      (void)add_next_timeout(now, multi, t->payload);
    }

  } while(t);

  *running_handles = multi->num_alive;
  return result;
}